

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O0

unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
 __thiscall
spvtools::opt::CopyPropagateArrays::FindSourceObjectIfPossible
          (CopyPropagateArrays *this,Instruction *var_inst,Instruction *store_inst)

{
  bool bVar1;
  Op OVar2;
  pointer this_00;
  Instruction *ptr_inst;
  __uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
  in_RCX;
  undefined1 local_30 [8];
  unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
  source;
  Instruction *store_inst_local;
  Instruction *var_inst_local;
  CopyPropagateArrays *this_local;
  
  source._M_t.
  super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
  .super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
        )(__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
          )in_RCX.
           super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
           .super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>.
           _M_head_impl;
  OVar2 = opt::Instruction::opcode(store_inst);
  if (OVar2 != OpVariable) {
    __assert_fail("var_inst->opcode() == spv::Op::OpVariable && \"Expecting a variable.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp"
                  ,0x76,
                  "std::unique_ptr<CopyPropagateArrays::MemoryObject> spvtools::opt::CopyPropagateArrays::FindSourceObjectIfPossible(Instruction *, Instruction *)"
                 );
  }
  if ((__uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
       )source._M_t.
        super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
        .super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>.
        _M_head_impl ==
      (__uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
       )0x0) {
    std::
    unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
    ::unique_ptr<std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,void>
              ((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                *)this,(nullptr_t)0x0);
  }
  else {
    bVar1 = HasValidReferencesOnly
                      ((CopyPropagateArrays *)var_inst,store_inst,
                       (Instruction *)
                       source._M_t.
                       super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                       .
                       super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>
                       ._M_head_impl);
    if (bVar1) {
      opt::Instruction::GetSingleWordInOperand
                ((Instruction *)
                 source._M_t.
                 super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                 .super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>.
                 _M_head_impl,1);
      GetSourceObjectIfAny((CopyPropagateArrays *)local_30,(uint32_t)var_inst);
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_30);
      if (bVar1) {
        this_00 = std::
                  unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                  ::operator->((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                *)local_30);
        ptr_inst = MemoryObject::GetVariable(this_00);
        bVar1 = HasNoStores((CopyPropagateArrays *)var_inst,ptr_inst);
        if (bVar1) {
          std::
          unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
          ::unique_ptr((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                        *)this,(unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                *)local_30);
        }
        else {
          std::
          unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
          ::unique_ptr<std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,void>
                    ((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                      *)this,(nullptr_t)0x0);
        }
      }
      else {
        std::
        unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
        ::unique_ptr<std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,void>
                  ((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                    *)this,(nullptr_t)0x0);
      }
      std::
      unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
      ::~unique_ptr((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                     *)local_30);
    }
    else {
      std::
      unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
      ::unique_ptr<std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,void>
                ((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                  *)this,(nullptr_t)0x0);
    }
  }
  return (__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<CopyPropagateArrays::MemoryObject>
CopyPropagateArrays::FindSourceObjectIfPossible(Instruction* var_inst,
                                                Instruction* store_inst) {
  assert(var_inst->opcode() == spv::Op::OpVariable && "Expecting a variable.");

  // Check that the variable is a composite object where |store_inst|
  // dominates all of its loads.
  if (!store_inst) {
    return nullptr;
  }

  // Look at the loads to ensure they are dominated by the store.
  if (!HasValidReferencesOnly(var_inst, store_inst)) {
    return nullptr;
  }

  // If so, look at the store to see if it is the copy of an object.
  std::unique_ptr<MemoryObject> source = GetSourceObjectIfAny(
      store_inst->GetSingleWordInOperand(kStoreObjectInOperand));

  if (!source) {
    return nullptr;
  }

  // Ensure that |source| does not change between the point at which it is
  // loaded, and the position in which |var_inst| is loaded.
  //
  // For now we will go with the easy to implement approach, and check that the
  // entire variable (not just the specific component) is never written to.

  if (!HasNoStores(source->GetVariable())) {
    return nullptr;
  }
  return source;
}